

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  undefined1 local_1c0 [8];
  stringstream stream;
  long local_28 [2];
  
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c0);
  PrintJsonUnitTest((ostream *)&stream.field_0x8,unit_test);
  StringStreamToString((string *)&stream.field_0x180,(stringstream *)local_1c0);
  fputs((char *)stream._384_8_,__stream);
  if ((long *)stream._384_8_ != local_28) {
    operator_delete((void *)stream._384_8_,local_28[0] + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
  std::ios_base::~ios_base((ios_base *)&stream.field_0x78);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* jsonout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}